

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.h
# Opt level: O0

void __thiscall QPainter::drawImage(QPainter *this,QRect *r,QImage *image)

{
  int iVar1;
  QImage *in_RDX;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QFlags<Qt::ImageConversionFlag> *this_00;
  QRectF *in_stack_00000048;
  QImage *in_stack_00000050;
  QRectF *in_stack_00000058;
  QPainter *in_stack_00000060;
  ImageConversionFlags in_stack_0000016c;
  ImageConversionFlag in_stack_ffffffffffffff6c;
  QRectF local_48;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QRectF::QRectF(&local_28,in_RDI);
  iVar1 = QImage::width(in_RDX);
  this_00 = (QFlags<Qt::ImageConversionFlag> *)(double)iVar1;
  iVar1 = QImage::height(in_RDX);
  QRectF::QRectF(&local_48,0.0,0.0,(qreal)this_00,(double)iVar1);
  QFlags<Qt::ImageConversionFlag>::QFlags(this_00,in_stack_ffffffffffffff6c);
  drawImage(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,
            in_stack_0000016c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QPainter::drawImage(const QRect &r, const QImage &image)
{
    drawImage(r, image, QRectF(0, 0, image.width(), image.height()));
}